

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2scan_x.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = cbrt(1.0);
  dVar2 = cbrt(rho);
  dVar7 = rho * rho;
  dVar3 = exp((sigma * sigma * -0.1559676420330081 *
               ((1.0 / dVar2) / (dVar7 * dVar7 * rho)) * 1.2599210498948732 * 58.88045974722155) /
              288.0);
  dVar7 = (1.0 / (dVar2 * dVar2)) / dVar7;
  dVar9 = dVar7 * sigma * 1.5874010519681996;
  dVar8 = (1.0 - 0.065 / (((dVar3 * -0.12082102608751867 + 0.12345679012345678) * 1.8171205928321397
                           * 0.21733691746289932 * dVar9) / 24.0 + 0.065)) * 0.065;
  dVar7 = (1.0 / (sigma * 0.001 * dVar7 * 1.5874010519681996 * 0.125 + 4.557799872345597)) *
          (dVar9 * -0.125 + (1.0 / (dVar2 * dVar2 * rho)) * tau * 1.5874010519681996);
  dVar3 = 0.0;
  if (dVar7 <= 0.0) {
    dVar3 = dVar7;
  }
  dVar9 = exp(dVar3 * -0.667 * (1.0 / (1.0 - dVar3)));
  dVar3 = 2.5;
  if (dVar7 <= 2.5) {
    dVar3 = dVar7;
  }
  dVar10 = dVar3 * dVar3;
  dVar4 = dVar10 * dVar10;
  dVar5 = exp((double)(~-(ulong)(2.5 < dVar7) & 0xbfe1111111111111 |
                      (ulong)(0.8 / (1.0 - dVar7)) & -(ulong)(2.5 < dVar7)));
  if (sigma < 0.0) {
    dVar6 = sqrt(sigma);
  }
  else {
    dVar6 = SQRT(sigma);
  }
  dVar6 = dVar6 * 1.2599210498948732 * 1.5393389262365065 * ((1.0 / dVar2) / rho);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = exp(-17.140028381540095 / dVar6);
  dVar3 = dVar2 * dVar1 * 0.9847450218426964 * -0.375 *
          ((0.174 - dVar8) *
           (double)(-(ulong)(dVar7 <= 0.0) & (ulong)dVar9 |
                   ~-(ulong)(dVar7 <= 0.0) &
                   (~-(ulong)(dVar7 <= 2.5) & (ulong)(dVar5 * -1.24) |
                   (ulong)(dVar4 * -0.023185843322 * dVar3 * dVar10 +
                          dVar10 * dVar4 * 0.234528941479 +
                          dVar3 * dVar4 * -0.887998041597 +
                          dVar4 * 1.45129704449 +
                          dVar3 * dVar10 * -0.663086601049 +
                          dVar10 * -0.4445555 + dVar3 * -0.667 + 1.0) & -(ulong)(dVar7 <= 2.5))) +
           dVar8 + 1.0) * (1.0 - dVar6);
  *eps = (double)(~-(ulong)(rho * 0.5 <= 1e-11) & (ulong)(dVar3 + dVar3));
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps ) {

    (void)(lapl);
    (void)(eps);
    constexpr double t4 = constants::m_cbrt_3;
    constexpr double t5 = constants::m_cbrt_pi;
    constexpr double t23 = constants::m_cbrt_6;
    constexpr double t25 = constants::m_pi_sq;
    constexpr double t26 = constants::m_cbrt_pi_sq;
    constexpr double t32 = constants::m_cbrt_2;
    constexpr double t7 = t4 / t5;
    constexpr double t22 = 0.2e2 / 0.27e2 + 0.5e1 / 0.3e1 * eta;
    constexpr double t24 = t23 * t23;
    constexpr double t27 = t26 * t25;
    constexpr double t28 = 0.1e1 / t27;
    constexpr double t29 = t24 * t28;
    constexpr double t39 = dp2 * dp2;
    constexpr double t40 = t39 * t39;
    constexpr double t41 = 0.1e1 / t40;
    constexpr double t50 = t26 * t26;
    constexpr double t51 = 0.1e1 / t50;
    constexpr double t53 = t32 * t32;
    constexpr double t118 = 0.1e1 / t26;
    constexpr double t119 = t24 * t118;


    const double t3 = rho / 0.2e1 <= dens_tol;
    const double t8 = 0.1e1 <= zeta_tol;
    const double t9 = zeta_tol - 0.1e1;
    const double t11 = piecewise_functor_5( t8, t9, t8, -t9, 0.0 );
    const double t12 = 0.1e1 + t11;
    const double t14 = safe_math::cbrt( zeta_tol );
    const double t16 = safe_math::cbrt( t12 );
    const double t18 = piecewise_functor_3( t12 <= zeta_tol, t14 * zeta_tol, t16 * t12 );
    const double t19 = t7 * t18;
    const double t20 = safe_math::cbrt( rho );
    const double t30 = sigma * sigma;
    const double t33 = rho * rho;
    const double t34 = t33 * t33;
    const double t35 = t34 * rho;
    const double t37 = 0.1e1 / t20 / t35;
    const double t38 = t32 * t37;
    const double t45 = safe_math::exp( -t29 * t30 * t38 * t41 / 0.288e3 );
    const double t49 = ( -0.162742215233874e0 * t22 * t45 + 0.1e2 / 0.81e2 ) * t23;
    const double t52 = t49 * t51;
    const double t54 = sigma * t53;
    const double t55 = t20 * t20;
    const double t57 = 0.1e1 / t55 / t33;
    const double t58 = t54 * t57;
    const double t61 = k1 + t52 * t58 / 0.24e2;
    const double t65 = k1 * ( 0.1e1 - k1 / t61 );
    const double t66 = tau * t53;
    const double t67 = t55 * rho;
    const double t68 = 0.1e1 / t67;
    const double t71 = t66 * t68 - t58 / 0.8e1;
    const double t75 = t53 * t57;
    const double t78 = 0.3e1 / 0.1e2 * t24 * t50 + eta * sigma * t75 / 0.8e1;
    const double t79 = 0.1e1 / t78;
    const double t80 = t71 * t79;
    const double t81 = t80 <= 0.e0;
    const double t82 = 0.e0 < t80;
    const double t83 = piecewise_functor_3( t82, 0.0, t80 );
    const double t84 = c1 * t83;
    const double t85 = 0.1e1 - t83;
    const double t86 = 0.1e1 / t85;
    const double t88 = safe_math::exp( -t84 * t86 );
    const double t89 = t80 <= 0.25e1;
    const double t90 = 0.25e1 < t80;
    const double t91 = piecewise_functor_3( t90, 0.25e1, t80 );
    const double t93 = t91 * t91;
    const double t95 = t93 * t91;
    const double t97 = t93 * t93;
    const double t99 = t97 * t91;
    const double t101 = t97 * t93;
    const double t106 = piecewise_functor_3( t90, t80, 0.25e1 );
    const double t107 = 0.1e1 - t106;
    const double t110 = safe_math::exp( c2 / t107 );
    const double t112 = piecewise_functor_5( t81, t88, t89, 0.1e1 - 0.667e0 * t91 - 0.4445555e0 * t93 - 0.663086601049e0 * t95 + 0.145129704449e1 * t97 - 0.887998041597e0 * t99 + 0.234528941479e0 * t101 - 0.23185843322e-1 * t97 * t95, -d * t110 );
    const double t113 = 0.174e0 - t65;
    const double t115 = t112 * t113 + t65 + 0.1e1;
    const double t117 = safe_math::sqrt( 0.3e1 );
    const double t120 = safe_math::sqrt( sigma );
    const double t121 = t120 * t32;
    const double t123 = 0.1e1 / t20 / rho;
    const double t125 = t119 * t121 * t123;
    const double t126 = safe_math::sqrt( t125 );
    const double t130 = safe_math::exp( -0.98958e1 * t117 / t126 );
    const double t131 = 0.1e1 - t130;
    const double t135 = piecewise_functor_3( t3, 0.0, -0.3e1 / 0.8e1 * t19 * t20 * t115 * t131 );


    eps = 0.2e1 * t135;

  }